

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.cpp
# Opt level: O1

ostream * pstore::repo::operator<<(ostream *os,section_content *c)

{
  size_t sVar1;
  ostream *poVar2;
  ulong uVar3;
  byte *pbVar4;
  long lVar5;
  pointer __value;
  pointer __value_00;
  ostream_iterator<unsigned_int,_char,_std::char_traits<char>_> local_48;
  uint local_34;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"{ kind:",7);
  poVar2 = operator<<(os,c->kind);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", align:",8);
  local_48._M_stream = (ostream_type *)CONCAT71(local_48._M_stream._1_7_,c->align);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_48,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", data:[",8);
  sVar1 = (c->data).elements_;
  pbVar4 = (c->data).buffer_;
  local_48._M_string = ", ";
  local_48._M_stream = os;
  if (0 < (long)sVar1) {
    lVar5 = sVar1 + 1;
    do {
      local_34 = (uint)*pbVar4;
      std::ostream_iterator<unsigned_int,_char,_std::char_traits<char>_>::operator=
                (&local_48,&local_34);
      pbVar4 = pbVar4 + 1;
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"], ifixups:[",0xc);
  __value = (c->ifixups).
            super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_48._M_string = ", ";
  uVar3 = (long)(c->ifixups).
                super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)__value;
  local_48._M_stream = os;
  if (0 < (long)uVar3) {
    lVar5 = uVar3 / 0x18 + 1;
    do {
      std::ostream_iterator<pstore::repo::internal_fixup,_char,_std::char_traits<char>_>::operator=
                ((ostream_iterator<pstore::repo::internal_fixup,_char,_std::char_traits<char>_> *)
                 &local_48,__value);
      __value = __value + 1;
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"], xfixups:[",0xc);
  __value_00 = (c->xfixups).
               super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
               ._M_impl.super__Vector_impl_data._M_start;
  local_48._M_string = ", ";
  lVar5 = (long)(c->xfixups).
                super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)__value_00 >> 5;
  if (0 < lVar5) {
    lVar5 = lVar5 + 1;
    local_48._M_stream = os;
    do {
      std::ostream_iterator<pstore::repo::external_fixup,_char,_std::char_traits<char>_>::operator=
                ((ostream_iterator<pstore::repo::external_fixup,_char,_std::char_traits<char>_> *)
                 &local_48,__value_00);
      __value_00 = __value_00 + 1;
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  return os;
}

Assistant:

std::ostream & operator<< (std::ostream & os, section_content const & c) {
            os << "{ kind:" << c.kind << ", align:" << c.align << ", data:[";
            std::copy (std::begin (c.data), std::end (c.data),
                       std::ostream_iterator<unsigned> (os, ", "));
            os << "], ifixups:[";
            std::copy (std::begin (c.ifixups), std::end (c.ifixups),
                       std::ostream_iterator<internal_fixup> (os, ", "));
            os << "], xfixups:[";
            std::copy (std::begin (c.xfixups), std::end (c.xfixups),
                       std::ostream_iterator<external_fixup> (os, ", "));
            return os;
        }